

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O0

bool __thiscall Tetris::rotation(Tetris *this,int o)

{
  bool bVar1;
  int in_ESI;
  Tetris *in_RDI;
  int fromO;
  int local_18;
  bool local_1;
  
  if ((in_ESI < 0) || (3 < in_ESI)) {
    local_1 = false;
  }
  else if (in_RDI->orientation == in_ESI) {
    local_1 = true;
  }
  else {
    local_18 = in_RDI->orientation;
    while (bVar1 = isValid(in_RDI,-1,-1,local_18), bVar1) {
      if (local_18 == in_ESI) {
        return true;
      }
      local_18 = (local_18 + 1) % 4;
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Tetris::rotation(int o)
{
    if (o < 0 || o > 3)
        return false;

    if (orientation == o)
        return true;

    int fromO = orientation;
    while (true) {
        if (!isValid(-1, -1, fromO))
            return false;

        if (fromO == o)
            break;

        fromO = (fromO + 1) % 4;
    }
    return true;
}